

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  sqlite3 *db;
  Select *p;
  bool bVar4;
  Table *pTVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  i64 iVar10;
  char *pcVar11;
  i64 iVar12;
  FKey *pFVar13;
  Table *pTVar14;
  RenameToken **ppRVar15;
  RenameToken *pRVar16;
  RenameToken *pRVar17;
  RenameToken *pToken_1;
  long lVar18;
  Index *pIVar19;
  RenameToken **ppRVar20;
  long lVar21;
  RenameToken *pToken;
  TriggerStep *pTVar22;
  sqlite3_context *pCtx;
  uint uVar23;
  Parse sParse;
  RenameToken *local_278;
  RenameCtx local_268;
  sqlite3_context *local_240;
  Table *local_238;
  char *local_230;
  i64 local_228;
  sqlite3_xauth local_220;
  i64 local_218;
  char *local_210;
  sqlite3_value **local_208;
  Walker local_200;
  Parse local_1d0;
  
  db = context->pOut->db;
  local_240 = context;
  pcVar7 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar8 = (char *)sqlite3ValueText(argv[3],'\x01');
  pcVar9 = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar10 = sqlite3VdbeIntValue(argv[5]);
  pcVar11 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_218 = sqlite3VdbeIntValue(argv[7]);
  local_208 = argv;
  iVar12 = sqlite3VdbeIntValue(argv[8]);
  uVar23 = (uint)iVar10;
  if (((int)uVar23 < 0 || pcVar11 == (char *)0x0) ||
      (pcVar9 == (char *)0x0 || pcVar7 == (char *)0x0)) {
    return;
  }
  local_220 = db->xAuth;
  local_230 = pcVar7;
  local_210 = pcVar11;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  local_238 = sqlite3FindTable(db,pcVar9,pcVar8);
  if ((local_238 == (Table *)0x0) || ((int)local_238->nCol <= (int)uVar23)) {
    if (db->noSharedCache != '\0') {
      return;
    }
    btreeLeaveAll(db);
    return;
  }
  pcVar7 = local_238->aCol[uVar23 & 0x7fffffff].zName;
  local_268.pTab = (Table *)0x0;
  local_268.zOld = (char *)0x0;
  local_268.pList = (RenameToken *)0x0;
  local_268.iCol = 0xffffffff;
  if (uVar23 != (int)local_238->iPKey) {
    local_268.iCol = uVar23;
  }
  local_268.nList = 0;
  db->xAuth = (sqlite3_xauth)0x0;
  local_228 = iVar12;
  iVar6 = renameParseSql(&local_1d0,pcVar8,0,db,local_230,(int)iVar12);
  local_200.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_200.walkerDepth = 0;
  local_200.eCode = '\0';
  local_200._37_3_ = 0;
  local_200.pParse = &local_1d0;
  local_200.xExprCallback = renameColumnExprCb;
  local_200.xSelectCallback = renameColumnSelectCb;
  local_268.pTab = local_238;
  pCtx = local_240;
  local_200.u.pNC = (NameContext *)&local_268;
  if (iVar6 == 0) {
    if (local_1d0.pNewTable == (Table *)0x0) {
      if (local_1d0.pNewIndex == (Index *)0x0) {
        pcVar9 = (char *)0x0;
        if ((int)local_228 == 0) {
          pcVar9 = pcVar8;
        }
        iVar6 = renameResolveTrigger(&local_1d0,pcVar9);
        pTVar5 = local_238;
        pCtx = local_240;
        if (iVar6 != 0) goto LAB_001bea2b;
        pTVar22 = (local_1d0.pNewTrigger)->step_list;
        if (pTVar22 != (TriggerStep *)0x0) {
          do {
            if ((pTVar22->zTarget != (char *)0x0) &&
               (pTVar14 = sqlite3LocateTable(&local_1d0,0,pTVar22->zTarget,pcVar8),
               pTVar14 == pTVar5)) {
              if (pTVar22->pUpsert != (Upsert *)0x0) {
                renameColumnElistNames(&local_1d0,&local_268,pTVar22->pUpsert->pUpsertSet,pcVar7);
              }
              renameColumnIdlistNames(&local_1d0,&local_268,pTVar22->pIdList,pcVar7);
              renameColumnElistNames(&local_1d0,&local_268,pTVar22->pExprList,pcVar7);
            }
            pTVar22 = pTVar22->pNext;
          } while (pTVar22 != (TriggerStep *)0x0);
        }
        if (local_1d0.pTriggerTab == pTVar5) {
          renameColumnIdlistNames(&local_1d0,&local_268,(local_1d0.pNewTrigger)->pColumns,pcVar7);
        }
        renameWalkTrigger(&local_200,local_1d0.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_200,(local_1d0.pNewIndex)->aColExpr);
        if ((local_1d0.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          walkExpr(&local_200,(local_1d0.pNewIndex)->pPartIdxWhere);
        }
      }
      goto LAB_001bee14;
    }
    p = (local_1d0.pNewTable)->pSelect;
    if (p == (Select *)0x0) {
      if ((local_1d0.pNewTable)->zName != (char *)0x0) {
        lVar21 = 0;
        do {
          bVar1 = pcVar9[lVar21];
          bVar2 = (local_1d0.pNewTable)->zName[lVar21];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_001bee95;
          }
          else if (""[bVar1] != ""[bVar2]) break;
          lVar21 = lVar21 + 1;
        } while( true );
      }
      local_268.pTab = local_1d0.pNewTable;
      bVar4 = false;
      goto LAB_001beb89;
    }
    local_1d0.rc = 0;
    sqlite3SelectPrep(&local_1d0,p,(NameContext *)0x0);
    iVar6 = 7;
    if (db->mallocFailed == '\0') {
      iVar6 = local_1d0.rc;
    }
    pCtx = local_240;
    if (iVar6 == 0) {
      sqlite3WalkSelect(&local_200,p);
      goto LAB_001bee14;
    }
  }
  goto LAB_001bea2b;
LAB_001bec66:
  pcVar8 = pFVar13->aCol[lVar21].zCol;
  if (pcVar8 != (char *)0x0) {
    if (pcVar7 != (char *)0x0) {
      lVar18 = 0;
      do {
        bVar1 = pcVar8[lVar18];
        if (bVar1 == pcVar7[lVar18]) {
          if ((ulong)bVar1 == 0) goto LAB_001becc1;
        }
        else if (""[bVar1] != ""[(byte)pcVar7[lVar18]]) break;
        lVar18 = lVar18 + 1;
      } while( true );
    }
    goto LAB_001bed0e;
  }
  if (local_1d0.pRename == (RenameToken *)0x0 || pcVar7 != (char *)0x0) goto LAB_001bed0e;
  goto LAB_001becce;
LAB_001becc1:
  if (local_1d0.pRename == (RenameToken *)0x0) goto LAB_001bed0e;
LAB_001becce:
  ppRVar15 = &local_1d0.pRename;
  pRVar17 = local_1d0.pRename;
  if ((char *)(local_1d0.pRename)->p != pcVar8) {
    do {
      pRVar16 = pRVar17;
      pRVar17 = pRVar16->pNext;
      if (pRVar17 == (RenameToken *)0x0) goto LAB_001bed0e;
    } while ((char *)pRVar17->p != pcVar8);
    ppRVar15 = &pRVar16->pNext;
  }
  *ppRVar15 = pRVar17->pNext;
  pRVar17->pNext = local_278;
  iVar6 = iVar6 + 1;
  local_278 = pRVar17;
  local_268.pList = pRVar17;
  local_268.nList = iVar6;
LAB_001bed0e:
  lVar21 = lVar21 + 1;
  if (lVar21 == iVar3) goto LAB_001bed1a;
  goto LAB_001bebc6;
LAB_001bee95:
  local_268.pTab = local_1d0.pNewTable;
  ppRVar15 = &local_1d0.pRename;
  if (local_1d0.pRename != (RenameToken *)0x0) {
    pcVar8 = (local_1d0.pNewTable)->aCol[uVar23 & 0x7fffffff].zName;
    pRVar17 = local_1d0.pRename;
    ppRVar20 = ppRVar15;
    if ((char *)(local_1d0.pRename)->p != pcVar8) {
      do {
        pRVar16 = pRVar17;
        pRVar17 = pRVar16->pNext;
        if (pRVar17 == (RenameToken *)0x0) goto LAB_001beef2;
      } while ((char *)pRVar17->p != pcVar8);
      ppRVar20 = &pRVar16->pNext;
    }
    *ppRVar20 = pRVar17->pNext;
    pRVar17->pNext = local_268.pList;
    local_268.nList = local_268.nList + 1;
    local_268.pList = pRVar17;
  }
LAB_001beef2:
  if ((local_268.iCol < 0) && (local_1d0.pRename != (RenameToken *)0x0)) {
    pRVar17 = local_1d0.pRename;
    if ((i16 *)(local_1d0.pRename)->p != &(local_1d0.pNewTable)->iPKey) {
      do {
        pRVar16 = pRVar17;
        pRVar17 = pRVar16->pNext;
        if (pRVar17 == (RenameToken *)0x0) goto LAB_001bef45;
      } while ((i16 *)pRVar17->p != &(local_1d0.pNewTable)->iPKey);
      ppRVar15 = &pRVar16->pNext;
    }
    *ppRVar15 = pRVar17->pNext;
    pRVar17->pNext = local_268.pList;
    local_268.nList = local_268.nList + 1;
    local_268.pList = pRVar17;
  }
LAB_001bef45:
  sqlite3WalkExprList(&local_200,(local_1d0.pNewTable)->pCheck);
  pIVar19 = (local_1d0.pNewTable)->pIndex;
  if (pIVar19 != (Index *)0x0) {
    do {
      sqlite3WalkExprList(&local_200,pIVar19->aColExpr);
      pIVar19 = pIVar19->pNext;
    } while (pIVar19 != (Index *)0x0);
  }
  bVar4 = true;
  for (pIVar19 = local_1d0.pNewIndex; pIVar19 != (Index *)0x0; pIVar19 = pIVar19->pNext) {
    sqlite3WalkExprList(&local_200,pIVar19->aColExpr);
  }
LAB_001beb89:
  pFVar13 = (local_1d0.pNewTable)->pFKey;
  if (pFVar13 != (FKey *)0x0) {
    local_278 = local_268.pList;
    iVar6 = local_268.nList;
    do {
      iVar3 = pFVar13->nCol;
      if (0 < (long)iVar3) {
        lVar21 = 0;
LAB_001bebc6:
        if ((bVar4) &&
           (local_1d0.pRename != (RenameToken *)0x0 && pFVar13->aCol[lVar21].iFrom == uVar23)) {
          ppRVar15 = &local_1d0.pRename;
          pRVar17 = local_1d0.pRename;
          if ((sColMap *)(local_1d0.pRename)->p != pFVar13->aCol + lVar21) {
            do {
              pRVar16 = pRVar17;
              pRVar17 = pRVar16->pNext;
              if (pRVar17 == (RenameToken *)0x0) goto LAB_001bec30;
            } while ((sColMap *)pRVar17->p != pFVar13->aCol + lVar21);
            ppRVar15 = &pRVar16->pNext;
          }
          *ppRVar15 = pRVar17->pNext;
          pRVar17->pNext = local_278;
          iVar6 = iVar6 + 1;
          local_278 = pRVar17;
          local_268.pList = pRVar17;
          local_268.nList = iVar6;
        }
LAB_001bec30:
        if (pFVar13->zTo != (char *)0x0) {
          lVar18 = 0;
          do {
            bVar1 = pFVar13->zTo[lVar18];
            if (bVar1 == pcVar9[lVar18]) {
              if ((ulong)bVar1 == 0) goto LAB_001bec66;
            }
            else if (""[bVar1] != ""[(byte)pcVar9[lVar18]]) break;
            lVar18 = lVar18 + 1;
          } while( true );
        }
        goto LAB_001bed0e;
      }
LAB_001bed1a:
      pFVar13 = pFVar13->pNextFrom;
    } while (pFVar13 != (FKey *)0x0);
  }
LAB_001bee14:
  pCtx = local_240;
  iVar6 = renameEditSql(local_240,&local_268,local_230,local_210,(int)local_218);
  if (iVar6 == 0) goto LAB_001bee3d;
LAB_001bea2b:
  if (local_1d0.zErrMsg == (char *)0x0) {
    sqlite3_result_error_code(pCtx,iVar6);
  }
  else {
    renameColumnParseError(pCtx,0,local_208[1],local_208[2],&local_1d0);
  }
LAB_001bee3d:
  renameParseCleanup(&local_1d0);
  pRVar17 = local_268.pList;
  while (pRVar17 != (RenameToken *)0x0) {
    pRVar16 = pRVar17->pNext;
    sqlite3DbFreeNN(db,pRVar17);
    pRVar17 = pRVar16;
  }
  db->xAuth = local_220;
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}